

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

double __thiscall
CEPlanet::MeanAnomaly(CEPlanet *this,double mean_longitude_deg,double perihelion_long_deg,double T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = this->b_;
  dVar1 = this->c_;
  dVar3 = cos(this->f_ * T * 0.017453292519943295);
  dVar2 = this->s_;
  dVar4 = sin(T * this->f_ * 0.017453292519943295);
  for (dVar5 = dVar4 * dVar2 +
               dVar3 * dVar1 + dVar5 * T * T + (mean_longitude_deg - perihelion_long_deg);
      180.0 < dVar5; dVar5 = dVar5 + -360.0) {
  }
  for (; dVar5 < -180.0; dVar5 = dVar5 + 360.0) {
  }
  return dVar5;
}

Assistant:

double CEPlanet::MeanAnomaly(double mean_longitude_deg,
                             double perihelion_long_deg,
                             double T) const
{
    double M = mean_longitude_deg - perihelion_long_deg + (b_*T*T)
                + c_*std::cos(f_*T*DD2R) + s_*std::sin(f_*T*DD2R) ;
    // Scale M to be in the range (-180,180)
    while (M>180.0) M-=360.0 ;
    while (M<-180.0) M+=360.0 ;
    
    return M ;
}